

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O3

region * __thiscall
toml::detail::character_either::scan
          (region *__return_storage_ptr__,character_either *this,location *loc)

{
  element_type *peVar1;
  long lVar2;
  pointer puVar3;
  pointer puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  location first;
  location local_58;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar2)) {
    puVar4 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar4 != puVar3) {
      do {
        if (*(uchar *)(lVar2 + loc->location_) == *puVar4) {
          location::location(&local_58,loc);
          peVar1 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          uVar6 = loc->location_;
          lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start;
          uVar7 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - lVar2;
          if (uVar6 + 1 < uVar7) {
            if (*(char *)(lVar2 + uVar6) == '\n') {
              loc->line_number_ = loc->line_number_ + 1;
              sVar5 = 1;
            }
            else {
              sVar5 = loc->column_number_ + 1;
            }
            loc->column_number_ = sVar5;
            uVar8 = uVar6 + 1;
          }
          else {
            uVar8 = uVar6;
            if (uVar7 != uVar6) {
              sVar5 = loc->line_number_;
              sVar9 = loc->column_number_;
              do {
                if (*(char *)(lVar2 + uVar6) == '\n') {
                  sVar5 = sVar5 + 1;
                  loc->line_number_ = sVar5;
                  sVar9 = 1;
                }
                else {
                  sVar9 = sVar9 + 1;
                }
                loc->column_number_ = sVar9;
                uVar6 = uVar6 + 1;
                uVar8 = uVar7;
              } while (uVar7 != uVar6);
            }
          }
          loc->location_ = uVar8;
          (__return_storage_ptr__->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_58.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (__return_storage_ptr__->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               local_58.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_58.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_58.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_58.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_58.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_58.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->source_name_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->source_name_,
                     local_58.source_name_._M_dataplus._M_p,
                     local_58.source_name_._M_dataplus._M_p + local_58.source_name_._M_string_length
                    );
          __return_storage_ptr__->first_ = local_58.location_;
          __return_storage_ptr__->first_line_ = local_58.line_number_;
          __return_storage_ptr__->first_column_ = local_58.column_number_;
          sVar5 = loc->location_;
          sVar9 = loc->line_number_;
          __return_storage_ptr__->length_ = sVar5 - local_58.location_;
          __return_storage_ptr__->last_ = sVar5;
          __return_storage_ptr__->last_line_ = sVar9;
          __return_storage_ptr__->last_column_ = loc->column_number_;
          location::~location(&local_58);
          return __return_storage_ptr__;
        }
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar3);
    }
  }
  region::region(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region character_either::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    for(const auto c : this->chars_)
    {
        if(loc.current() == c)
        {
            const auto first = loc;
            loc.advance(1);
            return region(first, loc);
        }
    }
    return region{};
}